

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucmndata.cpp
# Opt level: O3

DataHeader *
offsetTOCLookupFn(UDataMemory *pData,char *tocEntryName,int32_t *pLength,UErrorCode *pErrorCode)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int *piVar6;
  uint uVar7;
  int32_t iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  
  piVar6 = (int *)pData->toc;
  if (piVar6 == (int *)0x0) {
    return pData->pHeader;
  }
  iVar5 = *piVar6;
  if ((long)iVar5 != 0) {
    uVar15 = 0;
    do {
      uVar9 = uVar15;
      cVar1 = tocEntryName[uVar9];
      cVar2 = *(char *)((long)piVar6 + uVar9 + (uint)piVar6[1]);
      if (cVar1 == '\0') break;
      uVar15 = uVar9 + 1;
    } while (cVar1 == cVar2);
    uVar7 = 0;
    if (cVar1 == cVar2) {
LAB_002efac6:
      uVar15 = (ulong)uVar7;
      iVar8 = -1;
      if ((int)(uVar7 + 1) < iVar5) {
        iVar8 = piVar6[uVar15 * 2 + 4] - piVar6[uVar15 * 2 + 2];
      }
      *pLength = iVar8;
      return (DataHeader *)((ulong)(uint)piVar6[uVar15 * 2 + 2] + (long)piVar6);
    }
    uVar10 = iVar5 - 1;
    uVar15 = 0;
    do {
      uVar11 = uVar15;
      cVar1 = tocEntryName[uVar11];
      cVar2 = *(char *)((long)piVar6 + uVar11 + (uint)piVar6[(long)iVar5 * 2 + -1]);
      if (cVar1 == '\0') break;
      uVar15 = uVar11 + 1;
    } while (cVar1 == cVar2);
    if (cVar1 == cVar2) {
      uVar7 = uVar10;
      if (0 < iVar5) goto LAB_002efac6;
    }
    else if (2 < iVar5) {
      iVar12 = 1;
      do {
        uVar7 = uVar10 + iVar12 >> 1;
        iVar14 = (int)uVar11;
        if ((int)uVar9 < (int)uVar11) {
          iVar14 = (int)uVar9;
        }
        lVar13 = 0;
        do {
          bVar3 = tocEntryName[lVar13 + iVar14];
          bVar4 = *(byte *)((long)piVar6 +
                           lVar13 + (ulong)(uint)piVar6[(ulong)uVar7 * 2 + 1] + (long)iVar14);
          lVar13 = lVar13 + 1;
          if (bVar3 == 0) break;
        } while (bVar3 == bVar4);
        uVar15 = (ulong)(iVar14 - 1) + lVar13;
        if (bVar3 < bVar4) {
          uVar11 = uVar15 & 0xffffffff;
          uVar10 = uVar7;
        }
        else {
          if (bVar3 == bVar4) goto LAB_002efac6;
          iVar12 = uVar7 + 1;
          uVar9 = uVar15 & 0xffffffff;
        }
        if ((int)uVar10 <= iVar12) {
          return (DataHeader *)0x0;
        }
      } while( true );
    }
  }
  return (DataHeader *)0x0;
}

Assistant:

static const DataHeader * U_CALLCONV
offsetTOCLookupFn(const UDataMemory *pData,
                  const char *tocEntryName,
                  int32_t *pLength,
                  UErrorCode *pErrorCode) {
    (void)pErrorCode;
    const UDataOffsetTOC  *toc = (UDataOffsetTOC *)pData->toc;
    if(toc!=NULL) {
        const char *base=(const char *)toc;
        int32_t number, count=(int32_t)toc->count;

        /* perform a binary search for the data in the common data's table of contents */
#if defined (UDATA_DEBUG_DUMP)
        /* list the contents of the TOC each time .. not recommended */
        for(number=0; number<count; ++number) {
            fprintf(stderr, "\tx%d: %s\n", number, &base[toc->entry[number].nameOffset]);
        }
#endif
        number=offsetTOCPrefixBinarySearch(tocEntryName, base, toc->entry, count);
        if(number>=0) {
            /* found it */
            const UDataOffsetTOCEntry *entry=toc->entry+number;
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Found.\n", tocEntryName);
#endif
            if((number+1) < count) {
                *pLength = (int32_t)(entry[1].dataOffset - entry->dataOffset);
            } else {
                *pLength = -1;
            }
            return (const DataHeader *)(base+entry->dataOffset);
        } else {
#ifdef UDATA_DEBUG
            fprintf(stderr, "%s: Not found.\n", tocEntryName);
#endif
            return NULL;
        }
    } else {
#ifdef UDATA_DEBUG
        fprintf(stderr, "returning header\n");
#endif

        return pData->pHeader;
    }
}